

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::BufferStorage::GetBufferParameterTest::iterate(GetBufferParameterTest *this)

{
  int iVar1;
  TestContext *pTVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ulong uVar4;
  size_type sVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MoveMapOwner MVar8;
  MessageBuilder local_e28;
  MessageBuilder local_ca8;
  MoveMapOwner local_b28;
  undefined1 local_b18 [8];
  MapOwner tmp;
  undefined1 local_b00 [4];
  GLint queried_access;
  int local_97c;
  MessageBuilder local_978;
  MessageBuilder local_7f8;
  MessageBuilder local_678;
  int local_4f4;
  MessageBuilder local_4f0;
  MessageBuilder local_370;
  MessageBuilder local_1f0;
  undefined1 local_60 [8];
  Buffer buffer;
  GLint local_40;
  GLint queried_size;
  GLint queried_immutable;
  GLint queried_flags;
  GLenum flags;
  GLenum access;
  testCase *test_case;
  GLuint i;
  bool test_result;
  Functions *gl;
  GetBufferParameterTest *this_local;
  
  gl = (Functions *)this;
  BufferStorage::Buffer::LoadExtDirectStateAccess((this->super_TestCase).m_context);
  if (m_direct_state_access_support == 0) {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_NOT_SUPPORTED,"Unsupported");
  }
  else {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar3->_vptr_RenderContext[3])();
    _i = (Functions *)CONCAT44(extraout_var,iVar1);
    test_case._7_1_ = 1;
    test_case._0_4_ = 0;
    while( true ) {
      uVar4 = (ulong)(uint)test_case;
      sVar5 = std::
              vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
              ::size(&this->m_test_cases);
      if (sVar5 <= uVar4) break;
      _flags = std::
               vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
               ::operator[](&this->m_test_cases,(ulong)(uint)test_case);
      queried_flags = _flags->m_access;
      queried_immutable = _flags->m_flags;
      queried_size = -1;
      local_40 = -1;
      buffer._20_4_ = 0xffffffff;
      BufferStorage::Buffer::Buffer((Buffer *)local_60,(this->super_TestCase).m_context);
      BufferStorage::Buffer::InitStorage
                ((Buffer *)local_60,0x8892,queried_immutable,0x20,iterate::data);
      BufferStorage::Buffer::Bind(_i,local_60._0_4_,0x8892);
      if (_i->getNamedBufferParameteriv != (glGetNamedBufferParameterivFunc)0x0) {
        BufferStorage::Buffer::GetNamedParameter(_i,local_60._0_4_,0x8220,&queried_size);
        BufferStorage::Buffer::GetNamedParameter(_i,local_60._0_4_,0x821f,&local_40);
        BufferStorage::Buffer::GetNamedParameter
                  (_i,local_60._0_4_,0x8764,(GLint *)&buffer.field_0x14);
        if (queried_size != queried_immutable) {
          test_case._7_1_ = 0;
          pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar6 = tcu::TestContext::getLog(pTVar2);
          tcu::TestLog::operator<<(&local_1f0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_1f0,
                              (char (*) [78])
                              "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: "
                             );
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&queried_size);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&queried_immutable);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1f0);
        }
      }
      if (queried_size != queried_immutable) {
        test_case._7_1_ = 0;
        pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar2);
        tcu::TestLog::operator<<(&local_370,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_370,
                            (char (*) [78])
                            "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: "
                           );
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&queried_size);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&queried_immutable);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_370);
      }
      if (local_40 != 1) {
        test_case._7_1_ = 0;
        pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar2);
        tcu::TestLog::operator<<(&local_4f0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_4f0,
                            (char (*) [82])
                            "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: "
                           );
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_40);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
        local_4f4 = 1;
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_4f4);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4f0);
      }
      if (buffer._20_4_ != 0x20) {
        test_case._7_1_ = 0;
        pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar2);
        tcu::TestLog::operator<<(&local_678,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_678,
                            (char (*) [69])
                            "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_SIZE: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&buffer.field_0x14);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&iterate::data_size);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_678);
      }
      queried_size = -1;
      local_40 = -1;
      buffer._20_4_ = 0xffffffff;
      BufferStorage::Buffer::GetParameter(_i,0x8892,0x8220,&queried_size);
      BufferStorage::Buffer::GetParameter(_i,0x8892,0x821f,&local_40);
      BufferStorage::Buffer::GetParameter(_i,0x8892,0x8764,(GLint *)&buffer.field_0x14);
      if (queried_size != queried_immutable) {
        test_case._7_1_ = 0;
        pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar2);
        tcu::TestLog::operator<<(&local_7f8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_7f8,
                            (char (*) [73])
                            "GetBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: "
                           );
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&queried_size);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&queried_immutable);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_7f8);
      }
      if (local_40 != 1) {
        test_case._7_1_ = 0;
        pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar2);
        tcu::TestLog::operator<<(&local_978,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_978,
                            (char (*) [77])
                            "GetBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: "
                           );
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_40);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
        local_97c = 1;
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_97c);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_978);
      }
      if (buffer._20_4_ != 0x20) {
        test_case._7_1_ = 0;
        pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar2);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_b00,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_b00,
                            (char (*) [64])
                            "GetBufferParameteriv reported invalid state of GL_BUFFER_SIZE: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&buffer.field_0x14);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&iterate::data_size);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_b00);
      }
      if (queried_flags != 0) {
        tmp.m_buffer._4_4_ = -1;
        MVar8 = BufferStorage::Buffer::MapRange((Buffer *)local_60,0,0x20,queried_flags);
        local_b28 = MVar8;
        BufferStorage::Buffer::MapOwner::MapOwner((MapOwner *)local_b18,&local_b28);
        if (_i->getNamedBufferParameteriv != (glGetNamedBufferParameterivFunc)0x0) {
          BufferStorage::Buffer::GetNamedParameter
                    (_i,local_60._0_4_,0x911f,(GLint *)((long)&tmp.m_buffer + 4));
        }
        if (tmp.m_buffer._4_4_ != queried_flags) {
          test_case._7_1_ = 0;
          pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar6 = tcu::TestContext::getLog(pTVar2);
          tcu::TestLog::operator<<(&local_ca8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_ca8,
                              (char (*) [77])
                              "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: "
                             );
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&tmp.m_buffer + 4));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&queried_flags);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_ca8);
        }
        tmp.m_buffer._4_4_ = -1;
        BufferStorage::Buffer::GetParameter(_i,0x8892,0x911f,(GLint *)((long)&tmp.m_buffer + 4));
        if (tmp.m_buffer._4_4_ != queried_flags) {
          test_case._7_1_ = 0;
          pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar6 = tcu::TestContext::getLog(pTVar2);
          tcu::TestLog::operator<<(&local_e28,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_e28,
                              (char (*) [72])
                              "GetBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: "
                             );
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&tmp.m_buffer + 4));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b48384);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&queried_flags);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_e28);
        }
        BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)local_b18);
      }
      BufferStorage::Buffer::Bind(_i,0,0x8892);
      BufferStorage::Buffer::~Buffer((Buffer *)local_60);
      test_case._0_4_ = (uint)test_case + 1;
    }
    if ((test_case._7_1_ & 1) == 1) {
      pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"Fail");
    }
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetBufferParameterTest::iterate()
{
	static const GLsizeiptr data_size = 32;
	static GLubyte			data[data_size];

	Buffer::LoadExtDirectStateAccess(m_context);

	// No GL45 or GL_ARB_direct_state_access support
	if (m_direct_state_access_support == FUNCTIONALITY_SUPPORT_NONE)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported");
		return tcu::TestNode::STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	for (GLuint i = 0; i < m_test_cases.size(); ++i)
	{
		const testCase& test_case = m_test_cases[i];
		const GLenum	access	= test_case.m_access;
		const GLenum	flags	 = test_case.m_flags;

		GLint queried_flags		= -1;
		GLint queried_immutable = -1;
		GLint queried_size		= -1;

		Buffer buffer(m_context);

		buffer.InitStorage(GL_ARRAY_BUFFER, flags, data_size, data);
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		if (0 != gl.getNamedBufferParameteriv)
		{
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_STORAGE_FLAGS, &queried_flags);
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_IMMUTABLE_STORAGE, &queried_immutable);
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_SIZE, &queried_size);

			if (queried_flags != (GLint)flags)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
					<< " expected: " << flags << tcu::TestLog::EndMessage;
			}
		}

		if (queried_flags != (GLint)flags)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
				<< " expected: " << flags << tcu::TestLog::EndMessage;
		}

		if (queried_immutable != GL_TRUE)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: "
				<< queried_immutable << " expected: " << GL_TRUE << tcu::TestLog::EndMessage;
		}

		if (queried_size != data_size)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_SIZE: " << queried_size
				<< " expected: " << data_size << tcu::TestLog::EndMessage;
		}

		queried_flags	 = -1;
		queried_immutable = -1;
		queried_size	  = -1;

		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_STORAGE_FLAGS, &queried_flags);
		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_IMMUTABLE_STORAGE, &queried_immutable);
		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_SIZE, &queried_size);

		if (queried_flags != (GLint)flags)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
				<< " expected: " << flags << tcu::TestLog::EndMessage;
		}

		if (queried_immutable != GL_TRUE)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: " << queried_immutable
				<< " expected: " << GL_TRUE << tcu::TestLog::EndMessage;
		}

		if (queried_size != data_size)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_SIZE: " << queried_size
				<< " expected: " << data_size << tcu::TestLog::EndMessage;
		}

		if (0 != access)
		{
			GLint queried_access = -1;

			Buffer::MapOwner tmp(buffer.MapRange(0 /* offset */, data_size, access));

			if (0 != gl.getNamedBufferParameteriv)
			{
				Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_ACCESS_FLAGS, &queried_access);
			}

			if (queried_access != (GLint)access)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: " << queried_access
					<< " expected: " << access << tcu::TestLog::EndMessage;
			}

			queried_access = -1;

			Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_ACCESS_FLAGS, &queried_access);

			if (queried_access != (GLint)access)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: " << queried_access
					<< " expected: " << access << tcu::TestLog::EndMessage;
			}
		}

		Buffer::Bind(gl, 0 /* id */, GL_ARRAY_BUFFER);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}